

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

int uECC_verify(uint8_t *public_key,uint8_t *message_hash,uint hash_size,uint8_t *signature,
               uECC_Curve curve)

{
  uECC_word_t *__src;
  ulong *puVar1;
  byte num_words;
  char cVar2;
  bool bVar3;
  int iVar4;
  uECC_word_t *Y1;
  uECC_Curve curve_00;
  wordcount_t i;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char num_words_00;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uECC_word_t *puVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  uECC_word_t rx [4];
  uECC_word_t z [4];
  uECC_word_t r [4];
  uECC_word_t *points [4];
  uECC_word_t s [4];
  uECC_word_t ty [4];
  uECC_word_t u1 [4];
  uECC_word_t tx [4];
  uECC_word_t ry [4];
  uECC_word_t u2 [4];
  uECC_word_t _public [8];
  uECC_word_t tz [4];
  uECC_word_t sum [8];
  uECC_word_t product [8];
  ulong auStack_1198 [12];
  ulong auStack_1138 [472];
  uECC_word_t local_278 [4];
  uECC_word_t *local_258;
  uECC_word_t *local_250;
  ulong local_248;
  uECC_Curve local_240;
  uECC_word_t local_238 [4];
  uECC_word_t local_218 [4];
  long local_1f8;
  uECC_word_t *local_1f0;
  uECC_word_t *local_1e8;
  uECC_word_t *local_1e0;
  uECC_word_t local_1d8 [4];
  uECC_word_t local_1b8 [4];
  uECC_word_t local_198 [4];
  uECC_word_t local_178 [4];
  uECC_word_t local_158 [4];
  uECC_word_t local_138 [4];
  uECC_word_t local_118 [8];
  uECC_word_t local_d8 [4];
  uECC_word_t local_b8 [8];
  uECC_word_t local_78 [9];
  
  iVar16 = curve->num_n_bits + 0x3f;
  iVar4 = curve->num_n_bits + 0x7e;
  if (-1 < iVar16) {
    iVar4 = iVar16;
  }
  num_words = curve->num_words;
  lVar15 = (long)(char)num_words;
  num_words_00 = (char)(iVar4 >> 6);
  local_278[(long)num_words_00 + -1] = 0;
  local_218[(long)num_words_00 + -1] = 0;
  local_1d8[(long)num_words_00 + -1] = 0;
  cVar2 = curve->num_bytes;
  local_240 = curve;
  uECC_vli_bytesToNative(local_118,public_key,(int)cVar2);
  uECC_vli_bytesToNative(local_118 + lVar15,public_key + cVar2,(int)cVar2);
  uECC_vli_bytesToNative(local_218,signature,(int)cVar2);
  uECC_vli_bytesToNative(local_1d8,signature + cVar2,(int)cVar2);
  curve_00 = local_240;
  if (0 < lVar15) {
    uVar14 = (ulong)num_words;
    uVar10 = 0;
    uVar8 = 0;
    do {
      uVar8 = uVar8 | local_218[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar14 != uVar10);
    if (('\0' < (char)num_words) && (uVar8 != 0)) {
      uVar8 = 0;
      uVar10 = 0;
      do {
        uVar10 = uVar10 | local_1d8[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar14 != uVar8);
      if (uVar10 != 0) {
        puVar13 = local_240->n;
        local_248 = (ulong)(uint)(iVar4 >> 6) & 0xff;
        uVar8 = local_248;
        do {
          uVar8 = uVar8 - 1;
          if ((char)uVar8 < '\0') {
            return 0;
          }
          uVar12 = (ulong)(((uint)uVar8 & 0x7f) << 3);
          uVar10 = *(ulong *)((long)puVar13 + uVar12);
          uVar12 = *(ulong *)((long)local_218 + uVar12);
          uVar9 = local_248;
          if (uVar12 < uVar10) goto LAB_0010690d;
        } while (uVar12 <= uVar10);
      }
    }
  }
  return 0;
LAB_0010690d:
  while( true ) {
    uVar9 = uVar9 - 1;
    if ((char)uVar9 < '\0') {
      return 0;
    }
    uVar10 = (ulong)(((uint)uVar9 & 0x7f) << 3);
    uVar8 = *(ulong *)((long)puVar13 + uVar10);
    uVar10 = *(ulong *)((long)local_1d8 + uVar10);
    if (uVar10 < uVar8) break;
    if (uVar8 < uVar10) {
      return 0;
    }
  }
  uECC_vli_modInv(local_238,local_1d8,puVar13,num_words_00);
  local_178[(long)num_words_00 + -5] = 0;
  bits2int(local_198,message_hash,hash_size,curve_00);
  uECC_vli_modMult(local_198,local_198,local_238,puVar13,num_words_00);
  local_250 = puVar13;
  uECC_vli_modMult(local_138,local_218,local_238,puVar13,num_words_00);
  if ('\0' < (char)num_words) {
    memcpy(local_b8,local_118,(ulong)((uint)num_words * 8));
  }
  puVar13 = local_b8 + lVar15;
  if ('\0' < (char)num_words) {
    memcpy(puVar13,local_118 + lVar15,(ulong)((uint)num_words * 8));
  }
  __src = curve_00->G;
  local_258 = puVar13;
  if ('\0' < (char)num_words) {
    memcpy(local_178,__src,(ulong)((uint)num_words * 8));
    memcpy(local_1b8,__src + lVar15,(ulong)((uint)num_words * 8));
  }
  puVar13 = curve_00->p;
  uECC_vli_modSub(local_238,local_b8,local_178,puVar13,num_words);
  Y1 = local_258;
  XYcZ_add(local_178,local_1b8,local_b8,local_258,curve_00);
  uECC_vli_modInv(local_238,local_238,puVar13,num_words);
  apply_z(local_b8,Y1,local_238,curve_00);
  local_1f8 = 0;
  local_1e8 = local_118;
  local_1f0 = __src;
  local_1e0 = local_b8;
  uVar5 = uECC_vli_numBits(local_198,num_words_00);
  uVar6 = uECC_vli_numBits(local_138,num_words_00);
  if ((short)uVar6 < (short)uVar5) {
    uVar6 = uVar5;
  }
  uVar7 = uVar6 - 1;
  lVar11 = (long)((int)(short)uVar7 >> 6);
  lVar11 = *(long *)((long)&local_1f8 +
                    (ulong)((uint)((local_138[lVar11] >> ((ulong)uVar7 & 0x3f) & 1) != 0) * 0x10 +
                           (uint)((local_178[lVar11 + -4] >> ((ulong)uVar7 & 0x3f) & 1) != 0) * 8));
  if ('\0' < (char)num_words) {
    uVar8 = 0;
    do {
      local_278[uVar8] = *(uECC_word_t *)(lVar11 + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar14 != uVar8);
  }
  if ('\0' < (char)num_words) {
    uVar8 = 0;
    do {
      local_158[uVar8] = *(uECC_word_t *)(lVar11 + lVar15 * 8 + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar14 != uVar8);
    if ('\0' < (char)num_words) {
      memset(local_238,0,(ulong)((uint)num_words * 8));
    }
  }
  local_238[0] = 1;
  if (-1 < (short)(uVar6 - 2)) {
    uVar8 = (ulong)(ushort)(uVar6 - 2);
    do {
      (*curve_00->double_jacobian)(local_278,local_158,local_238,curve_00);
      iVar16 = (int)uVar8;
      lVar11 = *(long *)((long)&local_1f8 +
                        (ulong)((uint)((local_138[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) * 0x10 +
                               (uint)((local_178[(uVar8 >> 6) - 4] >> (uVar8 & 0x3f) & 1) != 0) * 8)
                        );
      if (lVar11 != 0) {
        if ('\0' < (char)num_words) {
          uVar8 = 0;
          do {
            local_178[uVar8] = *(uECC_word_t *)(lVar11 + uVar8 * 8);
            uVar8 = uVar8 + 1;
          } while (uVar14 != uVar8);
        }
        if ('\0' < (char)num_words) {
          uVar8 = 0;
          do {
            local_1b8[uVar8] = *(uECC_word_t *)(lVar11 + lVar15 * 8 + uVar8 * 8);
            uVar8 = uVar8 + 1;
          } while (uVar14 != uVar8);
        }
        apply_z(local_178,local_1b8,local_238,curve_00);
        uECC_vli_modSub(local_d8,local_278,local_178,puVar13,num_words);
        XYcZ_add(local_178,local_1b8,local_278,local_158,curve_00);
        uECC_vli_mult(local_78,local_238,local_d8,curve_00->num_words);
        (*curve_00->mmod_fast)(local_238,local_78);
      }
      uVar8 = (ulong)(iVar16 - 1);
    } while (0 < iVar16);
  }
  uECC_vli_modInv(local_238,local_238,puVar13,num_words);
  apply_z(local_278,local_158,local_238,curve_00);
  uVar8 = local_248;
  do {
    uVar8 = uVar8 - 1;
    bVar3 = true;
    if ((char)uVar8 < '\0') break;
    uVar14 = (ulong)(((uint)uVar8 & 0x7f) << 3);
    uVar10 = *(ulong *)((long)local_250 + uVar14);
    uVar14 = *(ulong *)((long)local_278 + uVar14);
    if (uVar14 < uVar10) {
      bVar3 = false;
      break;
    }
  } while (uVar14 <= uVar10);
  if (bVar3 && '\0' < num_words_00) {
    uVar10 = 0;
    uVar8 = 0;
    do {
      uVar12 = local_250[uVar10] + uVar8;
      puVar1 = local_278 + uVar10;
      uVar14 = *puVar1;
      *puVar1 = *puVar1 - uVar12;
      if (uVar12 != 0) {
        uVar8 = (ulong)(uVar14 < uVar12);
      }
      uVar10 = uVar10 + 1;
    } while (local_248 != uVar10);
  }
  uVar8 = 0;
  lVar15 = (ulong)(byte)(num_words - 1) + 1;
  do {
    uVar8 = uVar8 | local_218[lVar15 + -1] ^ local_278[lVar15 + -1];
    lVar11 = lVar15 + -1;
    bVar3 = 0 < lVar15;
    lVar15 = lVar11;
  } while (lVar11 != 0 && bVar3);
  return (uint)(uVar8 == 0);
}

Assistant:

int uECC_verify(const uint8_t *public_key,
                const uint8_t *message_hash,
                unsigned hash_size,
                const uint8_t *signature,
                uECC_Curve curve) {
    uECC_word_t u1[uECC_MAX_WORDS], u2[uECC_MAX_WORDS];
    uECC_word_t z[uECC_MAX_WORDS];
    uECC_word_t sum[uECC_MAX_WORDS * 2];
    uECC_word_t rx[uECC_MAX_WORDS];
    uECC_word_t ry[uECC_MAX_WORDS];
    uECC_word_t tx[uECC_MAX_WORDS];
    uECC_word_t ty[uECC_MAX_WORDS];
    uECC_word_t tz[uECC_MAX_WORDS];
    const uECC_word_t *points[4];
    const uECC_word_t *point;
    bitcount_t num_bits;
    bitcount_t i;
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    uECC_word_t *_public = (uECC_word_t *)public_key;
#else
    uECC_word_t _public[uECC_MAX_WORDS * 2];
#endif    
    uECC_word_t r[uECC_MAX_WORDS], s[uECC_MAX_WORDS];
    wordcount_t num_words = curve->num_words;
    wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);

    rx[num_n_words - 1] = 0;
    r[num_n_words - 1] = 0;
    s[num_n_words - 1] = 0;

#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) r, signature, curve->num_bytes);
    bcopy((uint8_t *) s, signature + curve->num_bytes, curve->num_bytes);
#else
    uECC_vli_bytesToNative(_public, public_key, curve->num_bytes);
    uECC_vli_bytesToNative(
        _public + num_words, public_key + curve->num_bytes, curve->num_bytes);
    uECC_vli_bytesToNative(r, signature, curve->num_bytes);
    uECC_vli_bytesToNative(s, signature + curve->num_bytes, curve->num_bytes);
#endif

    /* r, s must not be 0. */
    if (uECC_vli_isZero(r, num_words) || uECC_vli_isZero(s, num_words)) {
        return 0;
    }

    /* r, s must be < n. */
    if (uECC_vli_cmp_unsafe(curve->n, r, num_n_words) != 1 ||
            uECC_vli_cmp_unsafe(curve->n, s, num_n_words) != 1) {
        return 0;
    }

    /* Calculate u1 and u2. */
    uECC_vli_modInv(z, s, curve->n, num_n_words); /* z = 1/s */
    u1[num_n_words - 1] = 0;
    bits2int(u1, message_hash, hash_size, curve);
    uECC_vli_modMult(u1, u1, z, curve->n, num_n_words); /* u1 = e/s */
    uECC_vli_modMult(u2, r, z, curve->n, num_n_words); /* u2 = r/s */

    /* Calculate sum = G + Q. */
    uECC_vli_set(sum, _public, num_words);
    uECC_vli_set(sum + num_words, _public + num_words, num_words);
    uECC_vli_set(tx, curve->G, num_words);
    uECC_vli_set(ty, curve->G + num_words, num_words);
    uECC_vli_modSub(z, sum, tx, curve->p, num_words); /* z = x2 - x1 */
    XYcZ_add(tx, ty, sum, sum + num_words, curve);
    uECC_vli_modInv(z, z, curve->p, num_words); /* z = 1/z */
    apply_z(sum, sum + num_words, z, curve);

    /* Use Shamir's trick to calculate u1*G + u2*Q */
    points[0] = 0;
    points[1] = curve->G;
    points[2] = _public;
    points[3] = sum;
    num_bits = smax(uECC_vli_numBits(u1, num_n_words),
                    uECC_vli_numBits(u2, num_n_words));

    point = points[(!!uECC_vli_testBit(u1, num_bits - 1)) |
                   ((!!uECC_vli_testBit(u2, num_bits - 1)) << 1)];
    uECC_vli_set(rx, point, num_words);
    uECC_vli_set(ry, point + num_words, num_words);
    uECC_vli_clear(z, num_words);
    z[0] = 1;

    for (i = num_bits - 2; i >= 0; --i) {
        uECC_word_t index;
        curve->double_jacobian(rx, ry, z, curve);

        index = (!!uECC_vli_testBit(u1, i)) | ((!!uECC_vli_testBit(u2, i)) << 1);
        point = points[index];
        if (point) {
            uECC_vli_set(tx, point, num_words);
            uECC_vli_set(ty, point + num_words, num_words);
            apply_z(tx, ty, z, curve);
            uECC_vli_modSub(tz, rx, tx, curve->p, num_words); /* Z = x2 - x1 */
            XYcZ_add(tx, ty, rx, ry, curve);
            uECC_vli_modMult_fast(z, z, tz, curve);
        }
    }

    uECC_vli_modInv(z, z, curve->p, num_words); /* Z = 1/Z */
    apply_z(rx, ry, z, curve);

    /* v = x1 (mod n) */
    if (uECC_vli_cmp_unsafe(curve->n, rx, num_n_words) != 1) {
        uECC_vli_sub(rx, rx, curve->n, num_n_words);
    }

    /* Accept only if v == r. */
    return (int)(uECC_vli_equal(rx, r, num_words));
}